

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::EdgeDescriptorSyntax::setChild
          (EdgeDescriptorSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar2;
  logic_error *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 0) {
    lVar6 = 0x18;
    lVar7 = 0x10;
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x12c8);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_b0 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_f0 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar6 = 0x28;
    lVar7 = 0x20;
  }
  pvVar2 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pIVar1 = pvVar2->info;
  *(undefined8 *)((long)&(this->super_SyntaxNode).parent + lVar7) = *(undefined8 *)pvVar2;
  *(Info **)((long)&(this->super_SyntaxNode).parent + lVar6) = pIVar1;
  return;
}

Assistant:

void EdgeDescriptorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: t1 = child.token(); return;
        case 1: t2 = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}